

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  char local_21;
  vector_<char> local_20;
  
  local_20.capacity = 2;
  local_20._size = 0;
  local_20.arr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)operator_new__(2);
  *(undefined2 *)
   local_20.arr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>
   ._M_head_impl = 0;
  local_21 = 'w';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 's';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'i';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'm';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'a';
  vector_<char>::insert(&local_20,1,&local_21);
  local_21 = 'a';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'k';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'r';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'a';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'm';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'k';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'h';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'a';
  vector_<char>::push_back(&local_20,&local_21);
  local_21 = 'n';
  vector_<char>::push_back(&local_20,&local_21);
  poVar1 = operator<<((ostream *)&std::cout,&local_20);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_20.capacity = 4;
  if (local_20.arr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0) {
    operator_delete__((void *)local_20.arr._M_t.
                              super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                              super__Head_base<0UL,_char_*,_false>._M_head_impl);
  }
  return 0;
}

Assistant:

int main() {
    vector_<char> arr;
    arr.push_back('w');
    arr.push_back('s');
    arr.push_back('i');
    arr.push_back('m');
    arr.insert(1, 'a');
    arr.push_back('a');
    arr.push_back('k');
    arr.push_back('r');
    arr.push_back('a');
    arr.push_back('m');
    arr.push_back('k');
    arr.push_back('h');
    arr.push_back('a');
    arr.push_back('n');
    cout << arr << endl;
    cout << sizeof(arr) << endl;
    arr.clear();
}